

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_storage_info.hpp
# Opt level: O3

void __thiscall
duckdb::IndexStorageInfo::IndexStorageInfo(IndexStorageInfo *this,IndexStorageInfo *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
  local_30;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  this->root = param_1->root;
  local_30._M_h = (__hashtable_alloc *)&this->options;
  (this->options)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->options)._M_h._M_bucket_count = (param_1->options)._M_h._M_bucket_count;
  (this->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options)._M_h._M_element_count = (param_1->options)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(param_1->options)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (param_1->options)._M_h._M_rehash_policy._M_next_resize;
  (this->options)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->options)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->options)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->options)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_30._M_h,&(param_1->options)._M_h,&local_30);
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  vector(&(this->allocator_infos).
          super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
         ,&(param_1->allocator_infos).
           super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
        );
  ::std::
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ::vector(&(this->buffers).
            super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
           ,&(param_1->buffers).
             super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
          );
  uVar4 = (param_1->root_block_ptr).offset;
  uVar5 = (param_1->root_block_ptr).unused_padding;
  (this->root_block_ptr).block_id = (param_1->root_block_ptr).block_id;
  (this->root_block_ptr).offset = uVar4;
  (this->root_block_ptr).unused_padding = uVar5;
  return;
}

Assistant:

IndexStorageInfo() {}